

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O0

ControlBlock * __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::create_initial_page
          (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  uintptr_t uVar1;
  bool bVar2;
  memory_order mVar3;
  __atomic_base<unsigned_long> _Var4;
  __atomic_base<unsigned_long> local_88;
  uintptr_t tail;
  ControlBlock *initial_page;
  ControlBlock *first_page;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *pLStack_68;
  LfQueue_ProgressGuarantee i_progress_guarantee_local;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *this_local;
  undefined4 local_54;
  uintptr_t local_50;
  __atomic_base<unsigned_long> *local_48;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *local_40;
  
  first_page._4_4_ = i_progress_guarantee;
  pLStack_68 = this;
  initial_page = create_page(this,i_progress_guarantee);
  if (initial_page == (ControlBlock *)0x0) {
    this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                  *)0x0;
  }
  else {
    tail = 0;
    bVar2 = std::atomic<density::detail::LfQueueControl_*>::compare_exchange_strong
                      (&this->m_initial_page,(__pointer_type *)&tail,initial_page,
                       memory_order_seq_cst);
    if (bVar2) {
      tail = (uintptr_t)initial_page;
    }
    else {
      discard_created_page(this,initial_page);
    }
    uVar1 = tail;
    local_88._M_i = 0xffc0;
    local_48 = &local_88;
    local_50 = tail;
    local_54 = 5;
    local_40 = this;
    mVar3 = std::__cmpexch_failure_order(memory_order_seq_cst);
    switch(0x2185935) {
    default:
      if (mVar3 - memory_order_consume < 2) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
      else if (mVar3 == memory_order_seq_cst) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
      else {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
      break;
    case 2:
      if (mVar3 - memory_order_consume < 2) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
      else if (mVar3 == memory_order_seq_cst) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
      else {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
      break;
    case 3:
      if (mVar3 - memory_order_consume < 2) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
      else if (mVar3 == memory_order_seq_cst) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
      else {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
      break;
    case 4:
      if (mVar3 - memory_order_consume < 2) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
      else if (mVar3 == memory_order_seq_cst) {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
      else {
        LOCK();
        _Var4._M_i = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar2 = local_88._M_i == _Var4._M_i;
        if (bVar2) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
          _Var4._M_i = local_88._M_i;
        }
        UNLOCK();
        if (!bVar2) {
          local_88._M_i = _Var4._M_i;
        }
      }
    }
    if (bVar2) {
      this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                    *)tail;
    }
    else {
      this_local = (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                    *)local_88._M_i;
    }
  }
  return (ControlBlock *)this_local;
}

Assistant:

DENSITY_NO_INLINE ControlBlock *
                              create_initial_page(LfQueue_ProgressGuarantee i_progress_guarantee)
            {
                // m_initial_page = initial_page = create_page()
                auto const first_page = create_page(i_progress_guarantee);
                if (first_page == nullptr)
                {
                    return nullptr;
                }

                /* note: in case of failure of the following CAS we do not give in even if we are wait-free,
                    because this is a one-shot operation, so we can't possibly stick in a loop. */
                ControlBlock * initial_page = nullptr;
                if (m_initial_page.compare_exchange_strong(initial_page, first_page))
                {
                    initial_page = first_page;
                }
                else
                {
                    discard_created_page(first_page);
                }

                // m_tail = initial_page;
                auto tail = s_invalid_control_block;
                if (m_tail.compare_exchange_strong(tail, reinterpret_cast<uintptr_t>(initial_page)))
                {
                    return initial_page;
                }
                else
                {
                    return reinterpret_cast<ControlBlock *>(tail);
                }
            }